

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.h
# Opt level: O2

float __thiscall pbrt::Half::operator_cast_to_float(Half *this)

{
  uint uVar1;
  float fVar2;
  
  uVar1 = (uint)this->h << 0xd;
  if ((uVar1 & 0xf800000) == 0xf800000) {
    fVar2 = (float)(uVar1 | 0x70000000);
  }
  else if ((uVar1 & 0xf800000) == 0) {
    fVar2 = (float)(uVar1 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar2 = (float)((uVar1 & 0xfffe000) + 0x38000000);
  }
  return (float)((int)(short)this->h & 0x80000000U | (uint)fVar2);
}

Assistant:

operator float() const {
#ifdef PBRT_IS_GPU_CODE
        return __half2float(__ushort_as_half(h));
#else
        FP16 h;
        h.u = this->h;
        static const FP32 magic = {113 << 23};
        static const unsigned int shifted_exp = 0x7c00
                                                << 13;  // exponent mask after shift
        FP32 o;

        o.u = (h.u & 0x7fff) << 13;            // exponent/mantissa bits
        unsigned int exp = shifted_exp & o.u;  // just the exponent
        o.u += (127 - 15) << 23;               // exponent adjust

        // handle exponent special cases
        if (exp == shifted_exp)       // Inf/NaN?
            o.u += (128 - 16) << 23;  // extra exp adjust
        else if (exp == 0) {          // Zero/Denormal?
            o.u += 1 << 23;           // extra exp adjust
            o.f -= magic.f;           // renormalize
        }

        o.u |= (h.u & 0x8000) << 16;  // sign bit
        return o.f;
#endif
    }